

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode append2query(GlobalConfig *global,OperationConfig *config,per_transfer *per,char *q)

{
  undefined8 local_48;
  char *updated;
  long lStack_38;
  CURLUcode uerr;
  CURLU *uh;
  char *pcStack_28;
  CURLcode result;
  char *q_local;
  per_transfer *per_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  uh._4_4_ = CURLE_OK;
  pcStack_28 = q;
  q_local = (char *)per;
  per_local = (per_transfer *)config;
  config_local = (OperationConfig *)global;
  lStack_38 = curl_url();
  if (lStack_38 != 0) {
    updated._4_4_ = curl_url_set(lStack_38,0,*(undefined8 *)(q_local + 0x68),0x200);
    if (updated._4_4_ == CURLUE_OK) {
      local_48 = 0;
      updated._4_4_ = curl_url_set(lStack_38,8,pcStack_28,0x100);
      if (updated._4_4_ == CURLUE_OK) {
        updated._4_4_ = curl_url_get(lStack_38,0,&local_48,0x200);
      }
      if (updated._4_4_ == CURLUE_OK) {
        free(*(void **)(q_local + 0x68));
        *(undefined8 *)(q_local + 0x68) = local_48;
      }
      else {
        uh._4_4_ = urlerr_cvt(updated._4_4_);
      }
    }
    else {
      uh._4_4_ = urlerr_cvt(updated._4_4_);
      errorf((GlobalConfig *)config_local,"(%d) Could not parse the URL, failed to set query",
             (ulong)uh._4_4_);
      *(uint *)((long)&per_local[2].heads.init + 4) =
           *(uint *)((long)&per_local[2].heads.init + 4) & 0xfffeffff | 0x10000;
    }
    curl_url_cleanup(lStack_38);
  }
  return uh._4_4_;
}

Assistant:

static CURLcode append2query(struct GlobalConfig *global,
                             struct OperationConfig *config,
                             struct per_transfer *per,
                             const char *q)
{
  CURLcode result = CURLE_OK;
  CURLU *uh = curl_url();
  if(uh) {
    CURLUcode uerr;
    uerr = curl_url_set(uh, CURLUPART_URL, per->url,
                        CURLU_GUESS_SCHEME);
    if(uerr) {
      result = urlerr_cvt(uerr);
      errorf(global, "(%d) Could not parse the URL, "
             "failed to set query", result);
      config->synthetic_error = TRUE;
    }
    else {
      char *updated = NULL;
      uerr = curl_url_set(uh, CURLUPART_QUERY, q, CURLU_APPENDQUERY);
      if(!uerr)
        uerr = curl_url_get(uh, CURLUPART_URL, &updated,
                            CURLU_GUESS_SCHEME);
      if(uerr)
        result = urlerr_cvt(uerr);
      else {
        free(per->url); /* free previous URL */
        per->url = updated; /* use our new URL instead! */
      }
    }
    curl_url_cleanup(uh);
  }
  return result;
}